

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O0

DWARFDebugFrame * __thiscall llvm::DWARFContext::getDebugFrame(DWARFContext *this)

{
  DWARFDataExtractor Data;
  bool bVar1;
  int iVar2;
  int iVar3;
  ArchType Arch;
  type Obj;
  pointer pDVar4;
  undefined4 extraout_var;
  DWARFDebugFrame *this_00;
  pointer this_01;
  unique_ptr<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_> *this_02;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  DWARFSection *local_58;
  undefined1 local_40 [8];
  DWARFDataExtractor debugFrameData;
  DWARFContext *this_local;
  
  debugFrameData.Section = (DWARFSection *)this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->DebugFrame);
  if (bVar1) {
    this_local = (DWARFContext *)
                 std::unique_ptr<llvm::DWARFDebugFrame,_std::default_delete<llvm::DWARFDebugFrame>_>
                 ::get(&this->DebugFrame);
  }
  else {
    this_02 = &this->DObj;
    Obj = std::unique_ptr<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>::
          operator*(this_02);
    pDVar4 = std::unique_ptr<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
             ::operator->(this_02);
    iVar2 = (*pDVar4->_vptr_DWARFObject[0xd])();
    bVar1 = isLittleEndian(this);
    pDVar4 = std::unique_ptr<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
             ::operator->(this_02);
    iVar3 = (*pDVar4->_vptr_DWARFObject[6])();
    DWARFDataExtractor::DWARFDataExtractor
              ((DWARFDataExtractor *)local_40,Obj,(DWARFSection *)CONCAT44(extraout_var,iVar2),bVar1
               ,(uint8_t)iVar3);
    this_00 = (DWARFDebugFrame *)operator_new(0x28);
    Arch = getArch(this);
    DWARFDebugFrame::DWARFDebugFrame(this_00,Arch,false,0);
    std::unique_ptr<llvm::DWARFDebugFrame,_std::default_delete<llvm::DWARFDebugFrame>_>::reset
              (&this->DebugFrame,this_00);
    this_01 = std::unique_ptr<llvm::DWARFDebugFrame,_std::default_delete<llvm::DWARFDebugFrame>_>::
              operator->(&this->DebugFrame);
    memcpy(&local_78,local_40,0x28);
    Data.super_DataExtractor.Data.Length = uStack_70;
    Data.super_DataExtractor.Data.Data = (char *)local_78;
    Data.super_DataExtractor.IsLittleEndian = (undefined1)local_68;
    Data.super_DataExtractor.AddressSize = local_68._1_1_;
    Data.super_DataExtractor._18_6_ = local_68._2_6_;
    Data.Obj = (DWARFObject *)uStack_60;
    Data.Section = local_58;
    DWARFDebugFrame::parse(this_01,Data);
    this_local = (DWARFContext *)
                 std::unique_ptr<llvm::DWARFDebugFrame,_std::default_delete<llvm::DWARFDebugFrame>_>
                 ::get(&this->DebugFrame);
  }
  return (DWARFDebugFrame *)this_local;
}

Assistant:

const DWARFDebugFrame *DWARFContext::getDebugFrame() {
  if (DebugFrame)
    return DebugFrame.get();

  // There's a "bug" in the DWARFv3 standard with respect to the target address
  // size within debug frame sections. While DWARF is supposed to be independent
  // of its container, FDEs have fields with size being "target address size",
  // which isn't specified in DWARF in general. It's only specified for CUs, but
  // .eh_frame can appear without a .debug_info section. Follow the example of
  // other tools (libdwarf) and extract this from the container (ObjectFile
  // provides this information). This problem is fixed in DWARFv4
  // See this dwarf-discuss discussion for more details:
  // http://lists.dwarfstd.org/htdig.cgi/dwarf-discuss-dwarfstd.org/2011-December/001173.html
  DWARFDataExtractor debugFrameData(*DObj, DObj->getFrameSection(),
                                    isLittleEndian(), DObj->getAddressSize());
  DebugFrame.reset(new DWARFDebugFrame(getArch(), false /* IsEH */));
  DebugFrame->parse(debugFrameData);
  return DebugFrame.get();
}